

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffrwrg(char *rowlist,LONGLONG maxrows,int maxranges,int *numranges,long *minrow,long *maxrow,
          int *status)

{
  char *pcVar1;
  uint uVar2;
  ushort **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  char *pcVar8;
  char *local_58;
  char *local_50;
  long *local_48;
  ulong *local_40;
  ulong local_38;
  
  if (0 < *status) {
    return *status;
  }
  if (0 < maxrows) {
    *numranges = 0;
    pcVar8 = rowlist + -1;
    do {
      cVar7 = pcVar8[1];
      pcVar8 = pcVar8 + 1;
    } while (cVar7 == ' ');
    uVar6 = 0;
    local_50 = rowlist;
    local_38 = maxrows;
    do {
      local_58 = pcVar8;
      if (cVar7 != '-') {
        if (cVar7 != '\0') {
          ppuVar3 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar3 + (long)cVar7 * 2 + 1) & 8) != 0) {
            uVar4 = strtol(pcVar8,&local_58,10);
            pcVar8 = local_58;
            maxrows = local_38;
            goto LAB_0013b26f;
          }
LAB_0013b384:
          *status = 0x7e;
          pcVar8 = "Syntax error in this row range list:";
          goto LAB_0013b396;
        }
        if ((int)uVar6 == 0) {
          *minrow = 1;
          *maxrow = maxrows;
          *numranges = 1;
        }
        goto LAB_0013b3b4;
      }
      uVar4 = 1;
LAB_0013b26f:
      for (; cVar7 = *pcVar8, cVar7 == ' '; pcVar8 = pcVar8 + 1) {
      }
      uVar5 = uVar4;
      if ((cVar7 != '\0') && (cVar7 != ',')) {
        if (cVar7 != '-') goto LAB_0013b384;
        do {
          cVar7 = pcVar8[1];
          pcVar8 = pcVar8 + 1;
        } while ((long)cVar7 == 0x20);
        local_58 = pcVar8;
        local_48 = minrow;
        local_40 = (ulong *)maxrow;
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (long)cVar7 * 2 + 1) & 8) == 0) {
          uVar5 = maxrows;
          minrow = local_48;
          maxrow = (long *)local_40;
          pcVar8 = local_58;
          if ((cVar7 != '\0') && (cVar7 != ',')) goto LAB_0013b384;
        }
        else {
          uVar5 = strtol(pcVar8,&local_58,10);
          minrow = local_48;
          maxrow = (long *)local_40;
          pcVar8 = local_58;
        }
      }
      local_58 = pcVar8;
      uVar2 = *numranges;
      uVar6 = (ulong)uVar2;
      if (maxranges <= (int)uVar2) {
        *status = 0x7e;
        pcVar8 = "Overflowed maximum number of ranges (fits_parse_ranges)";
        goto LAB_0013b3af;
      }
      if ((long)uVar4 < 1) {
        *status = 0x7e;
        pcVar8 = "Syntax error in this row range list: row number < 1";
        goto LAB_0013b396;
      }
      if ((long)uVar5 < (long)uVar4) {
        *status = 0x7e;
        pcVar8 = "Syntax error in this row range list: min > max";
        goto LAB_0013b396;
      }
      if ((0 < (int)uVar2) && ((long)uVar4 <= (long)((ulong *)maxrow)[uVar6 - 1]))
      goto LAB_0013b41d;
      if ((long)uVar4 <= maxrows) {
        if ((ulong)maxrows <= uVar5) {
          uVar5 = maxrows;
        }
        minrow[(int)uVar2] = uVar4;
        ((ulong *)maxrow)[(int)uVar2] = uVar5;
        uVar6 = (ulong)(uVar2 + 1);
        *numranges = uVar2 + 1;
      }
      for (; *local_58 == ' '; local_58 = local_58 + 1) {
      }
      pcVar8 = local_58;
      if (*local_58 == ',') {
        do {
          pcVar8 = local_58 + 1;
          pcVar1 = local_58 + 1;
          local_58 = pcVar8;
        } while (*pcVar1 == ' ');
      }
      cVar7 = *pcVar8;
    } while( true );
  }
  *status = 0x7e;
  pcVar8 = "Input maximum range value is <= 0 (fits_parse_ranges)";
LAB_0013b3af:
  ffpmsg(pcVar8);
LAB_0013b3b4:
  return *status;
LAB_0013b41d:
  *status = 0x7e;
  ffpmsg("Syntax error in this row range list.  Range minimum is");
  pcVar8 = "  less than or equal to previous range maximum";
LAB_0013b396:
  ffpmsg(pcVar8);
  pcVar8 = local_50;
  goto LAB_0013b3af;
}

Assistant:

int ffrwrg(
      char *rowlist,      /* I - list of rows and row ranges */
      LONGLONG maxrows,       /* I - number of rows in the table */
      int maxranges,     /* I - max number of ranges to be returned */
      int *numranges,    /* O - number ranges returned */
      long *minrow,       /* O - first row in each range */
      long *maxrow,       /* O - last row in each range */
      int *status)        /* IO - status value */
{
/*
   parse the input list of row ranges, returning the number of ranges,
   and the min and max row value in each range. 

   The only characters allowed in the input rowlist are 
       decimal digits, minus sign, and comma (and non-significant spaces) 

   Example:  

     list = "10-20, 30-35,50"

   would return numranges = 3, minrow[] = {10, 30, 50}, maxrow[] = {20, 35, 50}

   error is returned if min value of range is > max value of range or if the
   ranges are not monotonically increasing.
*/
    char *next;
    long minval, maxval;

    if (*status > 0)
        return(*status);

    if (maxrows <= 0 ) {
        *status = RANGE_PARSE_ERROR;
        ffpmsg("Input maximum range value is <= 0 (fits_parse_ranges)");
        return(*status);
    }

    next = rowlist;
    *numranges = 0;

    while (*next == ' ')next++;   /* skip spaces */
   
    while (*next != '\0') {

      /* find min value of next range; *next must be '-' or a digit */
      if (*next == '-') {
          minval = 1;    /* implied minrow value = 1 */
      } else if ( isdigit((int) *next) ) {
          minval = strtol(next, &next, 10);
      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      while (*next == ' ')next++;   /* skip spaces */

      /* find max value of next range; *next must be '-', or ',' */
      if (*next == '-') {
          next++;
          while (*next == ' ')next++;   /* skip spaces */

          if ( isdigit((int) *next) ) {
              maxval = strtol(next, &next, 10);
          } else if (*next == ',' || *next == '\0') {
              maxval = (long) maxrows;  /* implied max value */
          } else {
              *status = RANGE_PARSE_ERROR;
              ffpmsg("Syntax error in this row range list:");
              ffpmsg(rowlist);
              return(*status);
          }
      } else if (*next == ',' || *next == '\0') {
          maxval = minval;  /* only a single integer in this range */
      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges + 1 > maxranges) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Overflowed maximum number of ranges (fits_parse_ranges)");
          return(*status);
      }

      if (minval < 1 ) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: row number < 1");
          ffpmsg(rowlist);
          return(*status);
      }

      if (maxval < minval) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: min > max");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges > 0) {
          if (minval <= maxrow[(*numranges) - 1]) {
             *status = RANGE_PARSE_ERROR;
             ffpmsg("Syntax error in this row range list.  Range minimum is");
             ffpmsg("  less than or equal to previous range maximum");
             ffpmsg(rowlist);
             return(*status);
         }
      }

      if (minval <= maxrows) {   /* ignore range if greater than maxrows */
          if (maxval > maxrows)
              maxval = (long) maxrows;

           minrow[*numranges] = minval;
           maxrow[*numranges] = maxval;

           (*numranges)++;
      }

      while (*next == ' ')next++;   /* skip spaces */
      if (*next == ',') {
           next++;
           while (*next == ' ')next++;   /* skip more spaces */
      }
    }

    if (*numranges == 0) {  /* a null string was entered */
         minrow[0] = 1;
         maxrow[0] = (long) maxrows;
         *numranges = 1;
    }

    return(*status);
}